

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# visualize.hpp
# Opt level: O0

void visualize::drawListElement<double>
               (double elem,uint index,uint total,uint highest,Renderer *render,Color *color)

{
  uint uVar1;
  int iVar2;
  uint y1;
  int x1;
  int x;
  int elem_height;
  int elem_width;
  int s_height;
  int s_width;
  Color *color_local;
  Renderer *render_local;
  uint highest_local;
  uint total_local;
  uint index_local;
  double elem_local;
  
  uVar1 = SDL2pp::Renderer::GetOutputWidth(render);
  iVar2 = SDL2pp::Renderer::GetOutputHeight(render);
  y1 = iVar2 - 5;
  uVar1 = uVar1 / total;
  iVar2 = (int)((double)((ulong)y1 / (ulong)highest) * elem);
  x1 = index * uVar1;
  SDL2pp::Renderer::SetDrawColor(render,color);
  SDL2pp::Renderer::FillRect(render,x1,y1,x1 + uVar1,y1 - iVar2);
  SDL2pp::Renderer::SetDrawColor(render,0xff,0xff,0xff,0xff);
  SDL2pp::Renderer::DrawRect(render,x1,y1,x1 + uVar1,y1 - iVar2);
  return;
}

Assistant:

void drawListElement(T elem, unsigned index, unsigned total, unsigned highest , SDL2pp::Renderer &render, const SDL2pp::Color &color = {6, 202, 72}) {
        static_assert(std::is_arithmetic<T>::value,"Only arithmetic types are allowed to define graphs");
        int s_width = render.GetOutputWidth();
        int s_height = render.GetOutputHeight() - 5 ;
        int elem_width = s_width / total;
        int elem_height = ((s_height / highest) * elem) ;
        int x = index * elem_width;
        render.SetDrawColor(color);
        render.FillRect(x, s_height, x + elem_width, s_height - elem_height); // FILL COLOR
        render.SetDrawColor(255, 255, 255);
        render.DrawRect(x, s_height, x + elem_width, s_height - elem_height); // DRAW BORDER
    }